

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O1

void __thiscall CallStatement::print(CallStatement *this)

{
  ostream *poVar1;
  long *local_30;
  long local_28;
  long local_20 [2];
  
  (*(this->super_Function).super_Statement._vptr_Statement[3])(&local_30,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(char *)local_30,local_28);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"(",1);
  if (local_30 != local_20) {
    operator_delete(local_30,local_20[0] + 1);
  }
  if (this->_testlist != (Testlist *)0x0) {
    Testlist::print(this->_testlist);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,")",1);
  return;
}

Assistant:

void CallStatement::print() {
//    id().print();
    std::cout << id() << "(";
    if(testList() != nullptr) testList()->print();
    std::cout << ")";
}